

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ics_impl.cpp
# Opt level: O0

int ui::anon_unknown_0::CountNameserver(void)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  bool namespace_found;
  string local_238 [8];
  string line;
  ifstream file;
  size_t count;
  
  iVar2 = 0;
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),"/etc/resolv.conf",_S_in);
  std::__cxx11::string::string(local_238);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),local_238);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    uVar4 = std::__cxx11::string::empty();
    if ((((uVar4 & 1) == 0) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_238), *pcVar5 != '#')) &&
       (lVar6 = std::__cxx11::string::find((char *)local_238,0x1c2a66), lVar6 != -1)) {
      iVar2 = iVar2 + 1;
    }
  }
  std::__cxx11::string::~string(local_238);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return iVar2;
}

Assistant:

int CountNameserver() {
  size_t count = 0;
  std::ifstream file("/etc/resolv.conf");

  std::string line;
  while (std::getline(file, line)) {
    // Skip empty or commented lines.
    if (line.empty() || line[0] == '#')
      continue;

    bool namespace_found = line.find("nameserver") != std::string::npos;
    if (namespace_found)
      count++;
  }
  return count;
}